

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask19_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x13 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 0xd;
  *puVar1 = in[2] << 6 | *puVar1;
  *puVar1 = in[3] << 0x19 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] >> 7;
  *puVar1 = in[4] << 0xc | *puVar1;
  *puVar1 = in[5] << 0x1f | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] >> 1;
  *puVar1 = in[6] << 0x12 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] >> 0xe;
  *puVar1 = in[7] << 5 | *puVar1;
  *puVar1 = in[8] << 0x18 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[8] >> 8;
  *puVar1 = in[9] << 0xb | *puVar1;
  *puVar1 = in[10] << 0x1e | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[10] >> 2;
  *puVar1 = in[0xb] << 0x11 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0xb] >> 0xf;
  *puVar1 = in[0xc] << 4 | *puVar1;
  *puVar1 = in[0xd] << 0x17 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0xd] >> 9;
  *puVar1 = in[0xe] << 10 | *puVar1;
  *puVar1 = in[0xf] << 0x1d | *puVar1;
  out[9] = in[0xf] >> 3;
  return out + 10;
}

Assistant:

uint32_t *__fastpackwithoutmask19_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (19 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (19 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (19 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (19 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (19 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (19 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (19 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (19 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (19 - 16);
  ++in;

  return out + 1;
}